

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O2

void flatbuffers::php::PhpGenerator::BeginClass(StructDef *struct_def,string *code_ptr)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (struct_def->fixed == true) {
    std::operator+(&local_30,"class ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    std::operator+(&local_50,&local_30," extends Struct\n");
    std::__cxx11::string::append((string *)code_ptr);
  }
  else {
    std::operator+(&local_30,"class ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)struct_def);
    std::operator+(&local_50,&local_30," extends Table\n");
    std::__cxx11::string::append((string *)code_ptr);
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::append((char *)code_ptr);
  return;
}

Assistant:

static void BeginClass(const StructDef &struct_def, std::string *code_ptr) {
    std::string &code = *code_ptr;
    if (struct_def.fixed) {
      code += "class " + struct_def.name + " extends Struct\n";
    } else {
      code += "class " + struct_def.name + " extends Table\n";
    }
    code += "{\n";
  }